

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<std::array<unsigned_int,2ul>>
          (GeomPrimvar *this,array<unsigned_int,_2UL> *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  pointer pSVar2;
  uint32_t uVar3;
  array<unsigned_int,_2UL> *paVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar7;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  undefined1 local_54 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (dest == (array<unsigned_int,_2UL> *)0x0) {
joined_r0x004a7fab:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar7 = false;
      }
      else {
        uVar3 = (*pvVar1->type_id)();
        bVar7 = uVar3 == 4;
      }
      if ((bVar7) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x004a7fab;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 0)) ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar7 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        cVar6 = !bVar7;
        if (bVar7) {
          if (err == (string *)0x0) {
            return (bool)cVar6;
          }
          ::std::__cxx11::string::append((char *)err);
          return (bool)cVar6;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar2 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar2) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        paVar4 = tinyusdz::value::Value::as<std::array<unsigned_int,2ul>>(&pSVar2->value,false);
        if (paVar4 != (array<unsigned_int,_2UL> *)0x0) {
          uVar5 = *(undefined8 *)paVar4->_M_elems;
          goto LAB_004a80b8;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar3 = Attribute::type_id(this_00);
      bVar7 = IsSupportedGeomPrimvarType(uVar3);
      if (bVar7) {
        primvar::PrimVar::get_value<std::array<unsigned_int,2ul>>
                  ((optional<std::array<unsigned_int,_2UL>_> *)&local_78,&(this->_attr)._var);
        cVar6 = (char)local_78._M_dataplus._M_p;
        if ((char)local_78._M_dataplus._M_p != '\x01') {
          if (err == (string *)0x0) {
            return (bool)(char)local_78._M_dataplus._M_p;
          }
          local_98[0] = local_88;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_54._0_4_ = 0x25;
          Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    ((string *)&local_78,(fmt *)local_98,(string *)local_54,(uint *)(local_54 + 4),
                     in_R8);
          ::std::__cxx11::string::_M_append
                    ((char *)err,
                     CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
              &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_
                                    ),local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_54._4_8_ != &local_40) {
            operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
          }
          if (local_98[0] == local_88) {
            return (bool)cVar6;
          }
          operator_delete(local_98[0],local_88[0] + 1);
          return (bool)cVar6;
        }
        uVar5 = CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_);
        cVar6 = '\x01';
LAB_004a80b8:
        *(undefined8 *)dest->_M_elems = uVar5;
        return (bool)cVar6;
      }
      if (err != (string *)0x0) {
        local_98[0] = local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<std::__cxx11::string>(&local_78,(fmt *)local_98,(string *)(local_54 + 4),in_RCX)
        ;
        ::std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
                          local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}